

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O2

clause_size_t bal::Cnf::normalize_clause(uint32_t *literals,clause_size_t literals_size)

{
  uint uVar1;
  ushort uVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  
  if ((int)CONCAT62(in_register_00000032,literals_size) == 0) {
    __assert_fail("literals_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                  ,0xf3,
                  "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                 );
  }
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(literals,literals + literals_size);
  if (2 < *literals + 1) {
    uVar2 = 1;
    uVar3 = 1;
    while( true ) {
      if (literals_size == uVar3) {
        return uVar2;
      }
      uVar1 = literals[uVar3];
      if (uVar1 + 1 < 3) break;
      uVar4 = (ulong)uVar2;
      if (uVar1 != literals[uVar4 - 1]) {
        if ((literals[uVar4 - 1] ^ uVar1) == 1) {
          return 0;
        }
        if (uVar4 < uVar3) {
          literals[uVar4] = uVar1;
        }
        uVar2 = uVar2 + 1;
      }
      uVar3 = uVar3 + 1;
    }
    __assert_fail("literal_t__is_variable(literals[i])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                  ,0xfa,
                  "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                 );
  }
  __assert_fail("literal_t__is_variable(literals[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                ,0xf7,
                "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
               );
}

Assistant:

inline static clause_size_t normalize_clause(uint32_t* const literals, const clause_size_t literals_size) {
            assert(literals_size > 0);
            
            std::sort(literals, literals + literals_size);
            
            assert(literal_t__is_variable(literals[0]));
            clause_size_t validated_size = 1;
            for (auto i = 1; i < literals_size; i++) {
                assert(literal_t__is_variable(literals[i]));
                if (literals[i] == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring duplicate literal");
                    continue;
                } else if ((literals[i] ^ 0x1) == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring the clause, always satisfied");
                    return 0;
                } else {
                    if (validated_size < i) {
                        literals[validated_size] = literals[i];
                    };
                    validated_size++;
                };
            };
            
            return validated_size;
        }